

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsBandDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,ARKodeMem ark_mem,
                  ARKLsMem arkls_mem,ARKRhsFn fi,N_Vector tmp1,N_Vector tmp2)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  sunindextype sVar4;
  sunindextype sVar5;
  uint uVar6;
  int iVar7;
  realtype *prVar8;
  realtype *prVar9;
  realtype *prVar10;
  realtype *prVar11;
  realtype *prVar12;
  long lVar13;
  ulong uVar14;
  realtype *prVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  realtype rVar22;
  double dVar23;
  double dVar24;
  double local_c0;
  double local_b8;
  realtype *local_a8;
  
  uVar3 = SUNBandMatrix_Columns(Jac);
  sVar4 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar5 = SUNBandMatrix_LowerBandwidth(Jac);
  prVar8 = N_VGetArrayPointer(ark_mem->ewt);
  prVar9 = N_VGetArrayPointer(fy);
  prVar10 = N_VGetArrayPointer(tmp1);
  prVar11 = N_VGetArrayPointer(y);
  prVar12 = N_VGetArrayPointer(tmp2);
  if (ark_mem->constraintsSet == 0) {
    local_a8 = (realtype *)0x0;
  }
  else {
    local_a8 = N_VGetArrayPointer(ark_mem->constraints);
  }
  N_VScale(1.0,y,tmp2);
  dVar23 = ark_mem->uround;
  local_b8 = 0.0;
  if (0.0 < dVar23) {
    if (dVar23 < 0.0) {
      local_b8 = sqrt(dVar23);
    }
    else {
      local_b8 = SQRT(dVar23);
    }
  }
  rVar22 = N_VWrmsNorm(fy,ark_mem->rwt);
  local_c0 = 1.0;
  if ((rVar22 != 0.0) || (NAN(rVar22))) {
    local_c0 = rVar22 * (double)(int)uVar3 * ABS(ark_mem->h) * 1000.0 * ark_mem->uround;
  }
  uVar6 = sVar5 + sVar4 + 1;
  uVar2 = uVar3;
  if ((int)uVar6 < (int)uVar3) {
    uVar2 = uVar6;
  }
  uVar20 = -sVar4;
  uVar17 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar17 = 0;
  }
  lVar13 = (long)(int)uVar6;
  lVar21 = 0;
  uVar16 = 0;
  do {
    uVar14 = uVar16;
    if (uVar16 == uVar17) {
      return 0;
    }
    for (; (long)uVar14 < (long)(int)uVar3; uVar14 = uVar14 + lVar13) {
      dVar23 = ABS(prVar11[uVar14]) * local_b8;
      if (ABS(prVar11[uVar14]) * local_b8 <= local_c0 / prVar8[uVar14]) {
        dVar23 = local_c0 / prVar8[uVar14];
      }
      if (ark_mem->constraintsSet != 0) {
        dVar1 = local_a8[uVar14];
        dVar24 = ABS(dVar1);
        if ((dVar24 != 1.0) || (NAN(dVar24))) {
          if ((dVar24 == 2.0) && ((!NAN(dVar24) && (dVar1 * (prVar12[uVar14] + dVar23) <= 0.0))))
          goto LAB_004afb5d;
        }
        else if (dVar1 * (prVar12[uVar14] + dVar23) < 0.0) {
LAB_004afb5d:
          dVar23 = -dVar23;
        }
      }
      prVar12[uVar14] = dVar23 + prVar12[uVar14];
    }
    iVar7 = (*fi)(ark_mem->tcur,tmp2,tmp1,ark_mem->user_data);
    arkls_mem->nfeDQ = arkls_mem->nfeDQ + 1;
    lVar18 = lVar21;
    uVar14 = uVar16;
    uVar2 = uVar20;
    if (iVar7 != 0) {
      return iVar7;
    }
    while( true ) {
      uVar19 = 0;
      if (0 < (int)uVar2) {
        uVar19 = (ulong)uVar2;
      }
      if ((long)(int)uVar3 <= (long)uVar14) break;
      prVar12[uVar14] = prVar11[uVar14];
      prVar15 = SUNBandMatrix_Column(Jac,(int)uVar14);
      dVar23 = ABS(prVar11[uVar14]) * local_b8;
      if (ABS(prVar11[uVar14]) * local_b8 <= local_c0 / prVar8[uVar14]) {
        dVar23 = local_c0 / prVar8[uVar14];
      }
      if (ark_mem->constraintsSet != 0) {
        dVar1 = local_a8[uVar14];
        dVar24 = ABS(dVar1);
        if ((dVar24 != 1.0) || (NAN(dVar24))) {
          if ((dVar24 == 2.0) && ((!NAN(dVar24) && (dVar1 * (prVar12[uVar14] + dVar23) <= 0.0))))
          goto LAB_004afcde;
        }
        else if (dVar1 * (prVar12[uVar14] + dVar23) < 0.0) {
LAB_004afcde:
          dVar23 = -dVar23;
        }
      }
      iVar7 = sVar5 + (int)uVar14;
      if ((int)(uVar3 - 1) <= iVar7) {
        iVar7 = uVar3 - 1;
      }
      for (; (long)uVar19 <= (long)iVar7; uVar19 = uVar19 + 1) {
        *(double *)((long)prVar15 + uVar19 * 8 + lVar18) =
             (prVar10[uVar19] - prVar9[uVar19]) * (1.0 / dVar23);
      }
      lVar18 = lVar18 + lVar13 * -8;
      uVar14 = uVar14 + lVar13;
      uVar2 = uVar2 + uVar6;
    }
    uVar16 = uVar16 + 1;
    uVar20 = uVar20 + 1;
    lVar21 = lVar21 + -8;
  } while( true );
}

Assistant:

int arkLsBandDQJac(realtype t, N_Vector y, N_Vector fy,
                   SUNMatrix Jac, ARKodeMem ark_mem,
                   ARKLsMem arkls_mem, ARKRhsFn fi,
                   N_Vector tmp1, N_Vector tmp2)
{
  N_Vector     ftemp, ytemp;
  realtype     fnorm, minInc, inc, inc_inv, srur, conj;
  realtype    *col_j, *ewt_data, *fy_data, *ftemp_data, *y_data, *ytemp_data;
  realtype    *cns_data;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  int          retval = 0;

  /* access matrix dimensions */
  N = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = tmp1;
  ytemp = tmp2;

  /* Obtain pointers to the data for ewt, fy, ftemp, y, ytemp */
  ewt_data   = N_VGetArrayPointer(ark_mem->ewt);
  fy_data    = N_VGetArrayPointer(fy);
  ftemp_data = N_VGetArrayPointer(ftemp);
  y_data     = N_VGetArrayPointer(y);
  ytemp_data = N_VGetArrayPointer(ytemp);
  cns_data = (ark_mem->constraintsSet) ?
    N_VGetArrayPointer(ark_mem->constraints) : NULL;

  /* Load ytemp with y = predicted y vector */
  N_VScale(ONE, y, ytemp);

  /* Set minimum increment based on uround and norm of f */
  srur = SUNRsqrt(ark_mem->uround);
  fnorm = N_VWrmsNorm(fy, ark_mem->rwt);
  minInc = (fnorm != ZERO) ?
    (MIN_INC_MULT * SUNRabs(ark_mem->h) * ark_mem->uround * N * fnorm) : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group=1; group <= ngroups; group++) {

    /* Increment all y_j in group */
    for(j=group-1; j < N; j+=width) {
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) if yj has an inequality constraint. */
      if (ark_mem->constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate f with incremented y */
    retval = fi(ark_mem->tcur, ytemp, ftemp, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval != 0) break;

    /* Restore ytemp, then form and load difference quotients */
    for (j=group-1; j < N; j+=width) {
      ytemp_data[j] = y_data[j];
      col_j = SUNBandMatrix_Column(Jac, j);
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (ark_mem->constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      inc_inv = ONE/inc;
      i1 = SUNMAX(0, j-mupper);
      i2 = SUNMIN(j+mlower, N-1);
      for (i=i1; i <= i2; i++)
        SM_COLUMN_ELEMENT_B(col_j,i,j) = inc_inv * (ftemp_data[i] - fy_data[i]);
    }
  }

  return(retval);
}